

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMatrixSolver.h
# Opt level: O0

void __thiscall
TPZMatrixSolver<double>::SetMatrix
          (TPZMatrixSolver<double> *this,TPZAutoPointer<TPZBaseMatrix> *Refmat)

{
  TPZAutoPointer<TPZBaseMatrix> *in_RDI;
  TPZAutoPointer<TPZBaseMatrix> *in_stack_00000008;
  TPZAutoPointer<TPZBaseMatrix> *in_stack_ffffffffffffffb8;
  
  TPZAutoPointer<TPZBaseMatrix>::TPZAutoPointer(in_RDI,in_stack_ffffffffffffffb8);
  TPZAutoPointerDynamicCast<TPZMatrix<double>,TPZBaseMatrix>(in_stack_00000008);
  TPZAutoPointer<TPZMatrix<double>_>::operator=
            ((TPZAutoPointer<TPZMatrix<double>_> *)in_RDI,
             (TPZAutoPointer<TPZMatrix<double>_> *)in_stack_ffffffffffffffb8);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer((TPZAutoPointer<TPZMatrix<double>_> *)in_RDI);
  TPZAutoPointer<TPZBaseMatrix>::~TPZAutoPointer(in_RDI);
  return;
}

Assistant:

virtual void SetMatrix(TPZAutoPointer<TPZBaseMatrix> Refmat)
    {
        fContainer = TPZAutoPointerDynamicCast<TPZMatrix<TVar>>(Refmat);
    }